

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Data_Query_PDU.cpp
# Opt level: O2

void __thiscall KDIS::PDU::Data_Query_PDU::~Data_Query_PDU(Data_Query_PDU *this)

{
  (this->super_Simulation_Management_Header).super_Header.super_Header6._vptr_Header6 =
       (_func_int **)&PTR__Data_Query_PDU_00335330;
  std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
            (&(this->m_vVariableDatum).
              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>);
  std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
            (&(this->m_vFixedDatum).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)
  ;
  DATA_TYPE::TimeStamp::~TimeStamp(&this->m_TimeInterval);
  Simulation_Management_Header::~Simulation_Management_Header
            (&this->super_Simulation_Management_Header);
  return;
}

Assistant:

Data_Query_PDU::~Data_Query_PDU()
{
}